

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

void google::protobuf::internal::ExtensionSet::RegisterMessageExtension
               (MessageLite *containing_type,int number,FieldType type,bool is_repeated,
               bool is_packed,MessageLite *prototype)

{
  ExtensionInfo info;
  LogMessage *other;
  LogFinisher local_89;
  FieldType local_88;
  undefined1 uStack_87;
  undefined1 uStack_86;
  undefined5 uStack_85;
  MessageLite *pMStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  LogMessage local_68;
  
  if ((type & 0xfe) != 10) {
    LogMessage::LogMessage
              (&local_68,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/extension_set.cc"
               ,0xb1);
    other = LogMessage::operator<<
                      (&local_68,
                       "CHECK failed: type == WireFormatLite::TYPE_MESSAGE || type == WireFormatLite::TYPE_GROUP: "
                      );
    LogFinisher::operator=(&local_89,other);
    LogMessage::~LogMessage(&local_68);
  }
  uStack_70 = 0;
  info.is_repeated = is_repeated;
  info.type = type;
  info.is_packed = is_packed;
  info._3_5_ = uStack_85;
  info.field_3.enum_validity_check.func = (EnumValidityFuncWithArg *)prototype;
  info.field_3.enum_validity_check.arg = (void *)local_78;
  info.descriptor = (FieldDescriptor *)0x0;
  local_88 = type;
  uStack_87 = is_repeated;
  uStack_86 = is_packed;
  pMStack_80 = prototype;
  anon_unknown_23::Register(containing_type,number,info);
  return;
}

Assistant:

void ExtensionSet::RegisterMessageExtension(const MessageLite* containing_type,
                                            int number, FieldType type,
                                            bool is_repeated, bool is_packed,
                                            const MessageLite* prototype) {
  GOOGLE_CHECK(type == WireFormatLite::TYPE_MESSAGE ||
        type == WireFormatLite::TYPE_GROUP);
  ExtensionInfo info(type, is_repeated, is_packed);
  info.message_info = {prototype};
  Register(containing_type, number, info);
}